

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagecodec.hpp
# Opt level: O0

vec4 ImageCodec::decodeFLOAT_UINTVec<unsigned_char,3>(ImageCodec *param_1,void *ptr)

{
  byte bVar1;
  float *pfVar2;
  vec<4,_float,_(glm::precision)0> *in_RSI;
  int i;
  float upper;
  uchar *data;
  vec4 result;
  int local_30;
  vec<4,_float,_(glm::precision)0> *this;
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3 local_10;
  
  this = in_RSI;
  glm::vec<4,_float,_(glm::precision)0>::vec
            ((vec<4,_float,_(glm::precision)0> *)&local_10.field_0,0.0,0.0,0.0,1.0);
  for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
    bVar1 = *(byte *)((long)&in_RSI->field_0 + (long)local_30);
    pfVar2 = glm::vec<4,_float,_(glm::precision)0>::operator[]
                       (this,(length_type)((ulong)in_RSI >> 0x20));
    *pfVar2 = (float)bVar1 / 511.0;
  }
  return (anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3)
         (anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3)local_10.field_0;
}

Assistant:

static glm::vec4 decodeFLOAT_UINTVec(const ImageCodec*, const void* ptr) {
        static_assert(std::is_unsigned_v<TYPE>);
        static_assert((COMPONENTS > 0) && (COMPONENTS <= 4));
        auto data = reinterpret_cast<const TYPE*>(ptr);
        const auto upper = static_cast<float>((256u << sizeof(TYPE)) - 1u);
        glm::vec4 result(0.f, 0.f, 0.f, 1.f);
        for (int i = 0; i < COMPONENTS; ++i)
            result[i] = static_cast<float>(data[i]) / upper;
        return result;
    }